

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool CLI::detail::split_short(string *current,string *name,string *rest)

{
  char *pcVar1;
  bool bVar2;
  long *local_40 [2];
  long local_30 [2];
  
  if (current->_M_string_length < 2) {
    return false;
  }
  pcVar1 = (current->_M_dataplus)._M_p;
  if ((*pcVar1 == '-') && (bVar2 = valid_first_char<char>(pcVar1[1]), bVar2)) {
    ::std::__cxx11::string::substr((ulong)local_40,(ulong)current);
    ::std::__cxx11::string::operator=((string *)name,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    ::std::__cxx11::string::substr((ulong)local_40,(ulong)current);
    ::std::__cxx11::string::operator=((string *)rest,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    return true;
  }
  return false;
}

Assistant:

inline bool split_short(const std::string &current, std::string &name, std::string &rest) {
    if(current.size() > 1 && current[0] == '-' && valid_first_char(current[1])) {
        name = current.substr(1, 1);
        rest = current.substr(2);
        return true;
    } else
        return false;
}